

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

PList * p_ini_file_parameter_list(PIniFile *file,pchar *section,pchar *key)

{
  byte *__s;
  size_t sVar1;
  ushort **ppuVar2;
  pchar *ppVar3;
  bool bVar4;
  long local_458;
  psize buf_cnt;
  psize len;
  pchar buf [1025];
  pchar *str;
  pchar *val;
  PList *ret;
  pchar *key_local;
  pchar *section_local;
  PIniFile *file_local;
  
  val = (pchar *)0x0;
  __s = (byte *)pp_ini_file_find_parameter(file,section,key);
  if (__s == (byte *)0x0) {
    file_local = (PIniFile *)0x0;
  }
  else {
    sVar1 = strlen((char *)__s);
    if (((sVar1 < 3) || (*__s != 0x7b)) || (__s[sVar1 - 1] != 0x7d)) {
      p_free(__s);
      file_local = (PIniFile *)0x0;
    }
    else {
      len._0_1_ = 0;
      local_458 = 0;
      unique0x1000017f = __s;
      while( true ) {
        stack0xffffffffffffffc0 = unique0x100000ef + 1;
        bVar4 = false;
        if (*stack0xffffffffffffffc0 != 0) {
          bVar4 = *stack0xffffffffffffffc0 != 0x7d;
        }
        if (!bVar4) break;
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)(uint)*stack0xffffffffffffffc0] & 0x2000) == 0) {
          buf[local_458 + -8] = *stack0xffffffffffffffc0;
          local_458 = local_458 + 1;
        }
        else {
          buf[local_458 + -8] = '\0';
          if (local_458 != 0) {
            ppVar3 = p_strdup((pchar *)&len);
            val = (pchar *)p_list_append((PList *)val,ppVar3);
          }
          local_458 = 0;
        }
      }
      if (local_458 != 0) {
        buf[local_458 + -8] = '\0';
        ppVar3 = p_strdup((pchar *)&len);
        val = (pchar *)p_list_append((PList *)val,ppVar3);
      }
      p_free(__s);
      file_local = (PIniFile *)val;
    }
  }
  return (PList *)file_local;
}

Assistant:

P_LIB_API PList *
p_ini_file_parameter_list (const PIniFile	*file,
			   const pchar		*section,
			   const pchar		*key)
{
	PList		*ret = NULL;
	pchar		*val;
	const pchar	*str;
	pchar		buf[P_INI_FILE_MAX_LINE + 1];
	psize		len;
	psize		buf_cnt;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return NULL;

	len = strlen (val);

	if (len < 3 || val[0] != '{' || val[len - 1] != '}') {
		p_free (val);
		return NULL;
	}

	/* Skip first brace '{' symbol */
	str = val + 1;
	buf[0] = '\0';
	buf_cnt = 0;

	while (*str && *str != '}') {
		if (!isspace (* ((const puchar *) str)))
			buf[buf_cnt++] = *str;
		else {
			buf[buf_cnt] = '\0';

			if (buf_cnt > 0)
				ret = p_list_append (ret, p_strdup (buf));

			buf_cnt = 0;
		}

		++str;
	}

	if (buf_cnt > 0) {
		buf[buf_cnt] = '\0';
		ret = p_list_append (ret, p_strdup (buf));
	}

	p_free (val);

	return ret;
}